

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int libssh2_sftp_close_handle(LIBSSH2_SFTP_HANDLE *hnd)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  libssh2_nonblocking_states lVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  size_t sVar6;
  char *errmsg;
  uchar *puVar7;
  ulong buflen;
  LIBSSH2_SFTP *pLVar8;
  uchar *local_68;
  LIBSSH2_SFTP *local_60;
  uchar *s;
  ulong local_50;
  size_t data_len;
  char *local_40;
  time_t local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    iVar5 = -0x27;
  }
  else {
    local_38 = time((time_t *)0x0);
    local_40 = hnd->handle;
    do {
      pLVar8 = hnd->sftp;
      channel = pLVar8->channel;
      pLVar1 = channel->session;
      data_len = 0;
      iVar5 = (int)hnd->handle_len;
      local_68 = (uchar *)0x0;
      lVar2 = hnd->close_state;
      buflen = (ulong)(iVar5 + 0xd);
      iVar3 = 0;
      local_60 = pLVar8;
      if (lVar2 == libssh2_NB_state_idle) {
        pLVar8->last_errno = 0;
        local_50 = buflen;
        s = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        hnd->close_packet = s;
        if (s == (uchar *)0x0) {
          hnd->close_state = libssh2_NB_state_idle;
          iVar3 = _libssh2_error(pLVar1,-6,"Unable to allocate memory for FXP_CLOSE packet");
          lVar2 = hnd->close_state;
          buflen = local_50;
          goto LAB_00122fd3;
        }
        _libssh2_store_u32(&s,iVar5 + 9);
        *s = '\x04';
        uVar4 = pLVar8->request_id;
        pLVar8->request_id = uVar4 + 1;
        hnd->close_request_id = uVar4;
        s = s + 1;
        _libssh2_store_u32(&s,uVar4);
        _libssh2_store_str(&s,local_40,hnd->handle_len);
        hnd->close_state = libssh2_NB_state_created;
        iVar3 = 0;
        buflen = local_50;
LAB_0012307f:
        sVar6 = _libssh2_channel_write(channel,0,hnd->close_packet,buflen);
        pLVar8 = local_60;
        if (sVar6 != 0xffffffffffffffdb) {
          if (sVar6 == buflen) {
            hnd->close_state = libssh2_NB_state_sent;
          }
          else {
            hnd->close_state = libssh2_NB_state_idle;
            iVar3 = _libssh2_error(pLVar1,-7,"Unable to send FXP_CLOSE command");
          }
          (*pLVar1->free)(hnd->close_packet,&pLVar1->abstract);
          hnd->close_packet = (uchar *)0x0;
          lVar2 = hnd->close_state;
          goto LAB_001230ec;
        }
      }
      else {
LAB_00122fd3:
        pLVar8 = local_60;
        if (lVar2 == libssh2_NB_state_created) goto LAB_0012307f;
LAB_001230ec:
        if (lVar2 == libssh2_NB_state_sent) {
          iVar3 = sftp_packet_require(pLVar8,'e',hnd->close_request_id,&local_68,&data_len,9);
          if (iVar3 != 0) {
            if (iVar3 == -0x25) goto LAB_00123250;
            if (iVar3 == -0x26) {
              if (data_len != 0) {
                (*pLVar1->free)(local_68,&pLVar1->abstract);
              }
              local_68 = (uchar *)0x0;
              errmsg = "Packet too short in FXP_CLOSE command";
              iVar5 = -0x1f;
            }
            else {
              errmsg = "Error waiting for status message";
              iVar5 = iVar3;
            }
            _libssh2_error(pLVar1,iVar5,errmsg);
          }
          hnd->close_state = libssh2_NB_state_sent1;
          if (local_68 == (uchar *)0x0) goto LAB_001231e2;
          uVar4 = _libssh2_ntohu32(local_68 + 5);
          (*pLVar1->free)(local_68,&pLVar1->abstract);
          if (uVar4 != 0) {
            pLVar8->last_errno = uVar4;
            hnd->close_state = libssh2_NB_state_idle;
            iVar3 = _libssh2_error(pLVar1,-0x1f,"SFTP Protocol Error");
          }
        }
        else {
LAB_001231e2:
          if (iVar3 == 0) {
            __assert_fail("rc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                          ,0xa9d,"int sftp_close_handle(LIBSSH2_SFTP_HANDLE *)");
          }
        }
        _libssh2_list_remove(&hnd->node);
        if (hnd->handle_type == LIBSSH2_SFTP_HANDLE_FILE) {
          puVar7 = (hnd->u).file.data;
          if (puVar7 != (uchar *)0x0) goto LAB_00123220;
        }
        else if ((hnd->handle_type == LIBSSH2_SFTP_HANDLE_DIR) && ((hnd->u).dir.names_left != 0)) {
          puVar7 = (uchar *)(hnd->u).dir.names_packet;
LAB_00123220:
          (*pLVar1->free)(puVar7,&pLVar1->abstract);
        }
        sftp_packetlist_flush(hnd);
        pLVar8->read_state = libssh2_NB_state_idle;
        hnd->close_state = libssh2_NB_state_idle;
        (*pLVar1->free)(hnd,&pLVar1->abstract);
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
LAB_00123250:
      pLVar1 = hnd->sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar5 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar5 == 0);
  }
  return iVar5;
}

Assistant:

static int
sftp_close_handle(LIBSSH2_SFTP_HANDLE *handle)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 13);
    unsigned char *s, *data = NULL;
    int rc = 0;

    if(handle->close_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Closing handle"));
        s = handle->close_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!handle->close_packet) {
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for FXP_CLOSE "
                                "packet");
        }
        else {

            _libssh2_store_u32(&s, packet_len - 4);
            *(s++) = SSH_FXP_CLOSE;
            handle->close_request_id = sftp->request_id++;
            _libssh2_store_u32(&s, handle->close_request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            handle->close_state = libssh2_NB_state_created;
        }
    }

    if(handle->close_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, handle->close_packet,
                                          packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((ssize_t)packet_len != nwritten) {
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                "Unable to send FXP_CLOSE command");
        }
        else
            handle->close_state = libssh2_NB_state_sent;

        LIBSSH2_FREE(session, handle->close_packet);
        handle->close_packet = NULL;
    }

    if(handle->close_state == libssh2_NB_state_sent) {
        rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                                 handle->close_request_id, &data,
                                 &data_len, 9);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
            if(data_len > 0) {
                LIBSSH2_FREE(session, data);
            }
            data = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Packet too short in FXP_CLOSE command");
        }
        else if(rc) {
            _libssh2_error(session, rc,
                           "Error waiting for status message");
        }

        handle->close_state = libssh2_NB_state_sent1;
    }

    if(!data) {
        /* if it reaches this point with data unset, something unwanted
           happened for which we should have set an error code */
        assert(rc);

    }
    else {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);

        if(retcode != LIBSSH2_FX_OK) {
            sftp->last_errno = retcode;
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                "SFTP Protocol Error");
        }
    }

    /* remove this handle from the parent's list */
    _libssh2_list_remove(&handle->node);

    if(handle->handle_type == LIBSSH2_SFTP_HANDLE_DIR) {
        if(handle->u.dir.names_left)
            LIBSSH2_FREE(session, handle->u.dir.names_packet);
    }
    else if(handle->handle_type == LIBSSH2_SFTP_HANDLE_FILE) {
        if(handle->u.file.data)
            LIBSSH2_FREE(session, handle->u.file.data);
    }

    sftp_packetlist_flush(handle);
    sftp->read_state = libssh2_NB_state_idle;

    handle->close_state = libssh2_NB_state_idle;

    LIBSSH2_FREE(session, handle);

    return rc;
}